

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O1

bool loadDigitsDataset(Mat *trainData,Mat *responces,int *numRows,int *numCols,int *numImages)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  DIR *__dirp;
  dirent *pdVar6;
  size_t sVar7;
  float *pfVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  int *piVar14;
  char *__s1;
  undefined8 uVar15;
  char pathToImages [10];
  string digit;
  Mat mat;
  char text [257];
  char path [255];
  int local_3c8;
  _InputArray local_3c0;
  float local_3a8;
  uint local_3a4;
  uint local_3a0;
  int local_39c;
  _InputArray local_398;
  DIR *local_380;
  int local_378 [2];
  undefined8 local_370;
  undefined2 local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  Mat *local_340;
  Mat *local_338;
  int *local_330;
  int *local_328;
  ulong local_320;
  undefined8 local_318;
  undefined8 local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [2];
  int *local_2c8;
  long *local_2c0;
  Mat local_2a8 [272];
  Mat local_198 [96];
  char local_138 [264];
  
  *numImages = 0x307;
  local_310 = 0x30700000100;
  local_330 = numRows;
  local_328 = numCols;
  cv::Mat::Mat(local_2a8,&local_310,5);
  local_340 = trainData;
  cv::Mat::operator=(trainData,local_2a8);
  cv::Mat::~Mat(local_2a8);
  local_318 = 0x30700000001;
  cv::Mat::Mat(local_2a8,&local_318,5);
  cv::Mat::operator=(responces,local_2a8);
  cv::Mat::~Mat(local_2a8);
  iVar10 = 0;
  local_3c8 = 0;
  local_338 = responces;
  do {
    local_370 = 0x7374696769642f2e;
    local_368 = 0x33;
    sprintf(local_138,"%s/%d",&local_370);
    __dirp = opendir(local_138);
    if ((__dirp != (DIR *)0x0) && (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0)) {
      local_3a8 = (float)iVar10;
      local_380 = __dirp;
      do {
        __s1 = pdVar6->d_name;
        iVar5 = strcmp(__s1,".");
        if (iVar5 != 0) {
          iVar5 = strcmp(__s1,"..");
          iVar13 = (int)numImages;
          if (iVar5 != 0) {
            sprintf((char *)local_2a8,"/%s",__s1);
            local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
            sVar7 = strlen((char *)local_2a8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_360,local_2a8,local_2a8 + sVar7);
            std::operator+(local_308,local_138,&local_360);
            std::__cxx11::string::operator=((string *)&local_360,(string *)local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_308[0]._M_dataplus._M_p._4_4_,(uint)local_308[0]._M_dataplus._M_p)
                != &local_308[0].field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_308[0]._M_dataplus._M_p._4_4_,
                                       (uint)local_308[0]._M_dataplus._M_p),
                              local_308[0].field_2._M_allocated_capacity + 1);
            }
            cv::imread((string *)local_308,(int)&local_360);
            local_3c0.sz.width = 0;
            local_3c0.sz.height = 0;
            local_3c0.flags = 0x1010000;
            local_398.sz.width = 0;
            local_398.sz.height = 0;
            local_398.flags = 0x2010000;
            local_3c0.obj = local_308;
            local_398.obj = local_308;
            cv::cvtColor((cv *)&local_3c0,&local_398,(_OutputArray *)0x7,0,iVar13);
            local_3c0.sz.width = 0;
            local_3c0.sz.height = 0;
            local_3c0.flags = 0x1010000;
            local_398.sz.width = 0;
            local_398.sz.height = 0;
            local_398.flags = 0x2010000;
            local_3c0.obj = local_308;
            local_398.obj = local_308;
            cv::threshold(&local_3c0,(_OutputArray *)&local_398,200.0,255.0,8);
            local_3c0.sz.width = 0;
            local_3c0.sz.height = 0;
            local_3c0.flags = 0x2010000;
            local_3c0.obj = local_308;
            cv::Mat::convertTo((_OutputArray *)local_308,(int)&local_3c0,0.00392156862745098,0.0);
            *local_330 = 0x10;
            *local_328 = 0x10;
            local_3c0.sz.width = 0;
            local_3c0.sz.height = 0;
            local_3c0.flags = 0x1010000;
            local_398.sz.width = 0;
            local_398.sz.height = 0;
            local_398.flags = 0x2010000;
            local_378[0] = *local_330;
            local_378[1] = 0x10;
            local_3c0.obj = local_308;
            local_398.obj = local_308;
            cv::resize(0,0,&local_3c0,&local_398,local_378,0);
            cv::Mat::reshape((int)local_198,(int)local_308);
            cv::Mat::~Mat(local_198);
            __dirp = local_380;
            local_39c = local_308[0]._M_string_length._4_4_;
            uVar9 = local_3c8 * 0x100;
            local_320 = (ulong)uVar9;
            local_3a4 = *(uint *)local_340;
            local_3a0 = *(uint *)(local_340 + 0xc);
            piVar2 = *(int **)(local_340 + 0x40);
            lVar3 = *(long *)(local_340 + 0x10);
            plVar4 = *(long **)(local_340 + 0x48);
            piVar14 = (int *)(lVar3 + (long)(int)uVar9 * 4);
            uVar11 = 0;
            uVar15 = local_308[0].field_2._M_allocated_capacity;
            do {
              if ((((uint)local_308[0]._M_dataplus._M_p >> 0xe & 1) == 0) && (*local_2c8 != 1)) {
                if (local_2c8[1] == 1) {
                  piVar12 = (int *)(*local_2c0 * uVar11 + local_308[0].field_2._M_allocated_capacity
                                   );
                }
                else {
                  iVar5 = (int)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                      uVar11 & 0xffffffff) /
                               (long)local_308[0]._M_string_length._4_4_);
                  piVar12 = (int *)((long)iVar5 * *local_2c0 +
                                    (long)(iVar5 * local_308[0]._M_string_length._4_4_) * -4 +
                                   uVar15);
                }
              }
              else {
                piVar12 = (int *)(local_308[0].field_2._M_allocated_capacity + uVar11 * 4);
              }
              numImages = piVar14;
              if (((local_3a4 >> 0xe & 1) == 0) && (*piVar2 != 1)) {
                lVar1 = uVar11 + (long)(int)uVar9;
                if (piVar2[1] == 1) {
                  numImages = (int *)(lVar1 * *plVar4 + lVar3);
                }
                else {
                  iVar5 = (int)(uVar9 + (int)uVar11) / (int)local_3a0;
                  numImages = (int *)((long)iVar5 * *plVar4 + lVar3 +
                                     (lVar1 - (int)(iVar5 * local_3a0)) * 4);
                }
              }
              *numImages = *piVar12;
              uVar11 = uVar11 + 1;
              uVar15 = uVar15 + 4;
              piVar14 = piVar14 + 1;
            } while (uVar11 != 0x100);
            if ((((byte)local_338[1] & 0x40) == 0) && (**(int **)(local_338 + 0x40) != 1)) {
              if ((*(int **)(local_338 + 0x40))[1] == 1) {
                pfVar8 = (float *)((long)local_3c8 * **(long **)(local_338 + 0x48) +
                                  *(long *)(local_338 + 0x10));
              }
              else {
                pfVar8 = (float *)((long)(local_3c8 / *(int *)(local_338 + 0xc)) *
                                   **(long **)(local_338 + 0x48) + *(long *)(local_338 + 0x10) +
                                  (long)(local_3c8 % *(int *)(local_338 + 0xc)) * 4);
              }
            }
            else {
              pfVar8 = (float *)((long)local_3c8 * 4 + *(long *)(local_338 + 0x10));
            }
            *pfVar8 = local_3a8;
            cv::Mat::~Mat((Mat *)local_308);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != &local_360.field_2) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            local_3c8 = local_3c8 + 1;
          }
        }
        pdVar6 = readdir(__dirp);
      } while (pdVar6 != (dirent *)0x0);
    }
    closedir(__dirp);
    iVar10 = iVar10 + 1;
  } while (iVar10 != 10);
  return true;
}

Assistant:

bool loadDigitsDataset(Mat &trainData, Mat &responces, int &numRows, int &numCols, int &numImages){
    int num = 775;
    numImages = num;
    int size = 16 * 16;
    trainData = Mat(Size(size, num), CV_32FC1);
    responces = Mat(Size(1, num), CV_32FC1);
    int counter = 0;
    for(int i=0;i<=9;i++){
        // reading the images from the folder of tarining samples
        DIR *dir;
        struct dirent *ent;
        char pathToImages[]="./digits3"; // name of the folder containing images
        char path[255];
        sprintf(path, "%s/%d", pathToImages, i);
        if ((dir = opendir(path)) != NULL){
            while ((ent = readdir (dir)) != NULL){
                if (strcmp(ent->d_name, ".") != 0 && strcmp(ent->d_name, "..") != 0 ){
                    char text[257];
                    sprintf(text,"/%s",ent->d_name);
                    string digit(text);
                    digit=path+digit;
                    Mat mat=imread(digit,1); //loading the image
                    cvtColor(mat,mat, COLOR_RGB2GRAY);  //converting into grayscale
                    threshold(mat , mat , 200, 255 ,THRESH_OTSU); // preprocessing
                    mat.convertTo(mat,CV_32FC1,1.0/255.0); //necessary to convert images to CV_32FC1 for using K nearest neighbour algorithm
                    numRows = 16;
                    numCols = 16;
                    resize(mat, mat, Size(numRows, numCols ),0,0,INTER_NEAREST); // same size as our testing samples
                    //cout << "number " << i << endl;
                    //imshow("mat", mat);
                    //waitKey(0);
                    //cout << "M = " << endl << " " << mat << endl << endl;
                    mat.reshape(1,1);
                    for (int k=0; k<size;k++) {
                        trainData.at<float>(counter*size+k) = mat.at<float>(k); // storing the pixels of the image
                          
                        //trainData.at<float>(i ,counter*numCols+k) = mat.at<float>(k);
                    }

                    responces.at<float>(counter) = i; // stroing the responce corresponding to image
                    counter++;
                }
            }
        }
        closedir(dir);
    }
    return true;
}